

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O1

int interval_comp(int a,int b,int c,int d)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (((c <= a) && (uVar1 = 1, a <= c)) && (uVar1 = 0xffffffff, d <= b)) {
    uVar1 = (uint)(d < b);
  }
  return uVar1;
}

Assistant:

int interval_comp(int a, int b, int c, int d) {
    if (a < c) return -1;
    else if (a > c) return 1;
    else {
        if (b < d) return -1;
        else if (b > d) return 1;
        else return 0;
    }
}